

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O1

int curr_mon_load(monst *mtmp)

{
  int iVar1;
  obj *poVar2;
  
  iVar1 = 0;
  for (poVar2 = mtmp->minvent; poVar2 != (obj *)0x0; poVar2 = poVar2->nobj) {
    if ((poVar2->otyp != 0x214) || ((mtmp->data->mflags2 & 0x8000000) == 0)) {
      iVar1 = iVar1 + poVar2->owt;
    }
  }
  return iVar1;
}

Assistant:

int curr_mon_load(struct monst *mtmp)
{
	int curload = 0;
	struct obj *obj;

	for (obj = mtmp->minvent; obj; obj = obj->nobj) {
		if (obj->otyp != BOULDER || !throws_rocks(mtmp->data))
			curload += obj->owt;
	}

	return curload;
}